

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorButton(char *desc_id,ImVec4 *col,ImGuiColorEditFlags flags,ImVec2 *size_arg)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id_00;
  ImU32 IVar4;
  ImGuiWindow *this;
  float fVar5;
  float *local_160;
  float local_134;
  float local_11c;
  float local_114;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  undefined1 local_e0 [8];
  ImVec4 col_source;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b4;
  float local_ac;
  float local_a8;
  float mid_x;
  float off;
  ImRect bb_inner;
  float rounding;
  float grid_step;
  ImVec4 col_rgb_without_alpha;
  ImVec4 col_rgb;
  bool pressed;
  bool held;
  bool hovered;
  undefined1 local_60 [8];
  ImRect bb;
  ImVec2 size;
  float default_size;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *size_arg_local;
  ImGuiColorEditFlags flags_local;
  ImVec4 *col_local;
  char *desc_id_local;
  
  this = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,desc_id,(char *)0x0);
    fVar5 = GetFrameHeight();
    if ((size_arg->x != 0.0) || (local_114 = fVar5, NAN(size_arg->x))) {
      local_114 = size_arg->x;
    }
    if ((size_arg->y != 0.0) || (local_11c = fVar5, NAN(size_arg->y))) {
      local_11c = size_arg->y;
    }
    ImVec2::ImVec2(&bb.Max,local_114,local_11c);
    register0x00001200 = operator+(&(this->DC).CursorPos,&bb.Max);
    ImRect::ImRect((ImRect *)local_60,&(this->DC).CursorPos,(ImVec2 *)&col_rgb.w);
    if (bb.Max.y < fVar5) {
      local_134 = 0.0;
    }
    else {
      local_134 = (pIVar2->Style).FramePadding.y;
    }
    ItemSize((ImRect *)local_60,local_134);
    bVar3 = ItemAdd((ImRect *)local_60,id_00,(ImRect *)0x0,0);
    if (bVar3) {
      col_rgb.z._1_1_ =
           ButtonBehavior((ImRect *)local_60,id_00,(bool *)((long)&col_rgb.z + 3),
                          (bool *)((long)&col_rgb.z + 2),0);
      size_arg_local._4_4_ = flags;
      if ((flags & 2U) != 0) {
        size_arg_local._4_4_ = flags & 0xfff9ffff;
      }
      col_rgb_without_alpha.z = col->x;
      col_rgb_without_alpha.w = col->y;
      col_rgb.x = col->z;
      col_rgb.y = col->w;
      if ((size_arg_local._4_4_ & 0x10000000) != 0) {
        ColorConvertHSVtoRGB
                  (col_rgb_without_alpha.z,col_rgb_without_alpha.w,col_rgb.x,
                   &col_rgb_without_alpha.z,&col_rgb_without_alpha.w,&col_rgb.x);
      }
      ImVec4::ImVec4((ImVec4 *)&rounding,col_rgb_without_alpha.z,col_rgb_without_alpha.w,col_rgb.x,
                     1.0);
      fVar5 = ImMin<float>(bb.Max.x,bb.Max.y);
      bb_inner.Max.y = fVar5 / 2.99;
      bb_inner.Max.x = ImMin<float>((pIVar2->Style).FrameRounding,bb_inner.Max.y * 0.5);
      mid_x = (float)local_60._0_4_;
      off = (float)local_60._4_4_;
      bb_inner.Min = bb.Min;
      local_a8 = 0.0;
      if ((size_arg_local._4_4_ & 0x400) == 0) {
        local_a8 = -0.75;
        ImRect::Expand((ImRect *)&mid_x,-0.75);
      }
      if (((size_arg_local._4_4_ & 0x40000) == 0) || (1.0 <= col_rgb.y)) {
        if ((size_arg_local._4_4_ & 0x20000) == 0) {
          local_160 = &rounding;
        }
        else {
          local_160 = &col_rgb_without_alpha.z;
        }
        local_e0._0_4_ = local_160[0];
        local_e0._4_4_ = local_160[1];
        col_source._0_8_ = *(undefined8 *)(local_160 + 2);
        if (1.0 <= col_source.y) {
          pIVar1 = this->DrawList;
          IVar4 = GetColorU32((ImVec4 *)local_e0);
          ImDrawList::AddRectFilled(pIVar1,(ImVec2 *)&mid_x,&bb_inner.Min,IVar4,bb_inner.Max.x,0);
        }
        else {
          pIVar1 = this->DrawList;
          local_e8 = _mid_x;
          local_f0 = bb_inner.Min;
          IVar4 = GetColorU32((ImVec4 *)local_e0);
          fVar5 = bb_inner.Max.y;
          ImVec2::ImVec2(&local_f8,local_a8,local_a8);
          RenderColorRectWithAlphaCheckerboard
                    (pIVar1,local_e8,local_f0,IVar4,fVar5,local_f8,bb_inner.Max.x,0);
        }
      }
      else {
        local_ac = (float)(int)((mid_x + bb_inner.Min.x) * 0.5 + 0.5);
        pIVar1 = this->DrawList;
        ImVec2::ImVec2(&local_b4,mid_x + bb_inner.Max.y,off);
        local_c0 = bb_inner.Min;
        IVar4 = GetColorU32((ImVec4 *)&col_rgb_without_alpha.z);
        fVar5 = bb_inner.Max.y;
        ImVec2::ImVec2(&local_c8,local_a8 - bb_inner.Max.y,local_a8);
        RenderColorRectWithAlphaCheckerboard
                  (pIVar1,local_b4,local_c0,IVar4,fVar5,local_c8,bb_inner.Max.x,0xa0);
        pIVar1 = this->DrawList;
        ImVec2::ImVec2((ImVec2 *)&col_source.z,local_ac,bb_inner.Min.y);
        IVar4 = GetColorU32((ImVec4 *)&rounding);
        ImDrawList::AddRectFilled
                  (pIVar1,(ImVec2 *)&mid_x,(ImVec2 *)&col_source.z,IVar4,bb_inner.Max.x,0x50);
      }
      RenderNavHighlight((ImRect *)local_60,id_00,1);
      if ((size_arg_local._4_4_ & 0x400) == 0) {
        if ((pIVar2->Style).FrameBorderSize <= 0.0) {
          pIVar1 = this->DrawList;
          IVar4 = GetColorU32(7,1.0);
          ImDrawList::AddRect(pIVar1,(ImVec2 *)local_60,&bb.Min,IVar4,bb_inner.Max.x,0,1.0);
        }
        else {
          local_100.x = (float)local_60._0_4_;
          local_100.y = (float)local_60._4_4_;
          local_108 = bb.Min;
          RenderFrameBorder((ImVec2)local_60,bb.Min,bb_inner.Max.x);
        }
      }
      if (((pIVar2->ActiveId == id_00) && ((size_arg_local._4_4_ & 0x200) == 0)) &&
         (bVar3 = BeginDragDropSource(0), bVar3)) {
        if ((size_arg_local._4_4_ & 2) == 0) {
          SetDragDropPayload("_COL4F",&col_rgb_without_alpha.z,0x10,2);
        }
        else {
          SetDragDropPayload("_COL3F",&col_rgb_without_alpha.z,0xc,2);
        }
        ImVec2::ImVec2(&local_110,0.0,0.0);
        ColorButton(desc_id,col,size_arg_local._4_4_,&local_110);
        SameLine(0.0,-1.0);
        TextEx("Color",(char *)0x0,0);
        EndDragDropSource();
      }
      if (((size_arg_local._4_4_ & 0x40) == 0) && ((col_rgb.z._3_1_ & 1) != 0)) {
        ColorTooltip(desc_id,&col->x,size_arg_local._4_4_ & 0x18060002);
      }
      desc_id_local._7_1_ = (bool)(col_rgb.z._1_1_ & 1);
    }
    else {
      desc_id_local._7_1_ = false;
    }
  }
  else {
    desc_id_local._7_1_ = false;
  }
  return desc_id_local._7_1_;
}

Assistant:

bool ImGui::ColorButton(const char* desc_id, const ImVec4& col, ImGuiColorEditFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(desc_id);
    const float default_size = GetFrameHeight();
    const ImVec2 size(size_arg.x == 0.0f ? default_size : size_arg.x, size_arg.y == 0.0f ? default_size : size_arg.y);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(bb, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    if (flags & ImGuiColorEditFlags_NoAlpha)
        flags &= ~(ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf);

    ImVec4 col_rgb = col;
    if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(col_rgb.x, col_rgb.y, col_rgb.z, col_rgb.x, col_rgb.y, col_rgb.z);

    ImVec4 col_rgb_without_alpha(col_rgb.x, col_rgb.y, col_rgb.z, 1.0f);
    float grid_step = ImMin(size.x, size.y) / 2.99f;
    float rounding = ImMin(g.Style.FrameRounding, grid_step * 0.5f);
    ImRect bb_inner = bb;
    float off = 0.0f;
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        off = -0.75f; // The border (using Col_FrameBg) tends to look off when color is near-opaque and rounding is enabled. This offset seemed like a good middle ground to reduce those artifacts.
        bb_inner.Expand(off);
    }
    if ((flags & ImGuiColorEditFlags_AlphaPreviewHalf) && col_rgb.w < 1.0f)
    {
        float mid_x = IM_ROUND((bb_inner.Min.x + bb_inner.Max.x) * 0.5f);
        RenderColorRectWithAlphaCheckerboard(window->DrawList, ImVec2(bb_inner.Min.x + grid_step, bb_inner.Min.y), bb_inner.Max, GetColorU32(col_rgb), grid_step, ImVec2(-grid_step + off, off), rounding, ImDrawFlags_RoundCornersRight);
        window->DrawList->AddRectFilled(bb_inner.Min, ImVec2(mid_x, bb_inner.Max.y), GetColorU32(col_rgb_without_alpha), rounding, ImDrawFlags_RoundCornersLeft);
    }
    else
    {
        // Because GetColorU32() multiplies by the global style Alpha and we don't want to display a checkerboard if the source code had no alpha
        ImVec4 col_source = (flags & ImGuiColorEditFlags_AlphaPreview) ? col_rgb : col_rgb_without_alpha;
        if (col_source.w < 1.0f)
            RenderColorRectWithAlphaCheckerboard(window->DrawList, bb_inner.Min, bb_inner.Max, GetColorU32(col_source), grid_step, ImVec2(off, off), rounding);
        else
            window->DrawList->AddRectFilled(bb_inner.Min, bb_inner.Max, GetColorU32(col_source), rounding);
    }
    RenderNavHighlight(bb, id);
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        if (g.Style.FrameBorderSize > 0.0f)
            RenderFrameBorder(bb.Min, bb.Max, rounding);
        else
            window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), rounding); // Color button are often in need of some sort of border
    }

    // Drag and Drop Source
    // NB: The ActiveId test is merely an optional micro-optimization, BeginDragDropSource() does the same test.
    if (g.ActiveId == id && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropSource())
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F, &col_rgb, sizeof(float) * 3, ImGuiCond_Once);
        else
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F, &col_rgb, sizeof(float) * 4, ImGuiCond_Once);
        ColorButton(desc_id, col, flags);
        SameLine();
        TextEx("Color");
        EndDragDropSource();
    }

    // Tooltip
    if (!(flags & ImGuiColorEditFlags_NoTooltip) && hovered)
        ColorTooltip(desc_id, &col.x, flags & (ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf));

    return pressed;
}